

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

bool __thiscall
dlib::
matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
::aliases<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
          (matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
           *this,matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *item)

{
  bool bVar1;
  matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_> *in_RDI;
  matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *in_stack_ffffffffffffffd8;
  undefined1 local_11;
  
  bVar1 = matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>::
          aliases<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>(in_RDI,in_stack_ffffffffffffffd8)
  ;
  local_11 = true;
  if (!bVar1) {
    local_11 = matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>::
               aliases<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
                         (in_RDI,in_stack_ffffffffffffffd8);
  }
  return local_11;
}

Assistant:

bool aliases (
            const matrix_exp<U>& item
        ) const { return lhs.aliases(item) || rhs.aliases(item); }